

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O3

bool hasConnectedNodes(Network *nw)

{
  ostringstream *this;
  pointer ppLVar1;
  Link *pLVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  pointer ppLVar6;
  NetworkError *this_00;
  Node *pNVar7;
  undefined8 extraout_RAX;
  ostream *poVar8;
  int iVar9;
  ulong uVar10;
  string local_88;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> marked;
  value_type local_3e;
  allocator_type local_3d;
  undefined4 local_3c;
  
  uVar5 = Network::count(nw,NODE);
  local_3e = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_68,(long)(int)uVar5,&local_3e,&local_3d);
  ppLVar1 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar6 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar6 != ppLVar1; ppLVar6 = ppLVar6 + 1) {
    pLVar2 = *ppLVar6;
    *(char *)((long)local_68 + (long)(pLVar2->fromNode->super_Element).index) =
         *(char *)((long)local_68 + (long)(pLVar2->fromNode->super_Element).index) + '\x01';
    *(char *)((long)local_68 + (long)(pLVar2->toNode->super_Element).index) =
         *(char *)((long)local_68 + (long)(pLVar2->toNode->super_Element).index) + '\x01';
  }
  if ((int)uVar5 < 1) {
    iVar9 = 0;
  }
  else {
    this = &nw->msgLog;
    uVar10 = 0;
    iVar9 = 0;
    do {
      marked.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)this;
      if ((*(char *)((long)local_68 + uVar10) == '\0') &&
         (bVar4 = iVar9 < 10, iVar9 = iVar9 + 1, bVar4)) {
        this_00 = (NetworkError *)__cxa_allocate_exception(0x30);
        pNVar7 = Network::node(nw,(int)uVar10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar3 = (pNVar7->super_Element).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar3,pcVar3 + (pNVar7->super_Element).name._M_string_length
                  );
        local_3c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        NetworkError::NetworkError(this_00,8,&local_88);
        local_3c = 0;
        __cxa_throw(this_00,&NetworkError::typeinfo,ENerror::~ENerror);
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    if (10 < iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"\n\n NETWORK ERROR 233: no links connected to another ",0x34);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)this,iVar9 + -10);
      iVar9 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," nodes ",7);
    }
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68);
  }
  return iVar9 == 0;
}

Assistant:

bool hasConnectedNodes(Network* nw)
{
    int nodeCount = nw->count(Element::NODE);
    vector<char> marked(nodeCount, 0);
    for (Link* link : nw->links)
    {
        marked[link->fromNode->index]++;
        marked[link->toNode->index]++;
    }

    int unmarkedCount = 0;
    for (int i = 0; i < nodeCount; i++)
    {
        try
        {
            if ( !marked[i] )
            {
                unmarkedCount++;
                if ( unmarkedCount <= 10 )
                    throw NetworkError(
                        NetworkError::UNCONNECTED_NODE, nw->node(i)->name);
            }
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
        }
    }
    if ( unmarkedCount > 10 )
    {
        nw->msgLog << "\n\n NETWORK ERROR 233: no links connected to another "
                   << (unmarkedCount - 10) << " nodes ";
    }
    return (unmarkedCount == 0);
}